

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QSize __thiscall
QListViewPrivate::itemSize(QListViewPrivate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QListView *pQVar4;
  long *plVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate_1;
  int row;
  QAbstractItemDelegate *delegate;
  QListView *q;
  QModelIndex sample;
  QSize *in_stack_ffffffffffffff40;
  QSize *in_stack_ffffffffffffff50;
  QAbstractItemModel *pQVar6;
  QSize local_60;
  QPersistentModelIndex local_58 [3];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28 [3];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  if ((in_RDI->uniformItemSizes & 1U) == 0) {
    plVar5 = (long *)(**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).
                                            super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                 0x208))(pQVar4,in_RDX);
    if (plVar5 == (long *)0x0) {
      QSize::QSize(in_stack_ffffffffffffff40);
    }
    else {
      local_10 = (QSize)(**(code **)(*plVar5 + 0x68))(plVar5,in_RSI,in_RDX);
    }
  }
  else {
    bVar2 = QSize::isValid(in_stack_ffffffffffffff50);
    if (!bVar2) {
      pQVar6 = (in_RDI->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
      iVar3 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,local_28);
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (in_RDI->super_QAbstractItemViewPrivate).model;
      iVar1 = in_RDI->column;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_40,pQVar6,iVar3 + -1,iVar1,local_58);
      plVar5 = (long *)(**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).
                                              super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                   0x208))(pQVar4,&local_40);
      if (plVar5 == (long *)0x0) {
        QSize::QSize(in_stack_ffffffffffffff40);
      }
      else {
        local_60 = (QSize)(**(code **)(*plVar5 + 0x68))(plVar5,in_RSI,&local_40);
      }
      in_RDI->cachedItemSize = local_60;
    }
    local_10 = in_RDI->cachedItemSize;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QListViewPrivate::itemSize(const QStyleOptionViewItem &option, const QModelIndex &index) const
{
    Q_Q(const QListView);
    if (!uniformItemSizes) {
        const QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        return delegate ? delegate->sizeHint(option, index) : QSize();
    }
    if (!cachedItemSize.isValid()) { // the last item is probably the largest, so we use its size
        int row = model->rowCount(root) - 1;
        QModelIndex sample = model->index(row, column, root);
        const QAbstractItemDelegate *delegate = q->itemDelegateForIndex(sample);
        cachedItemSize = delegate ? delegate->sizeHint(option, sample) : QSize();
    }
    return cachedItemSize;
}